

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::EmitDerefOp(SQCompiler *this,SQOpcode op)

{
  SQInteger SVar1;
  SQInteger arg1;
  undefined4 in_ESI;
  long in_RDI;
  SQInteger src;
  SQInteger key;
  SQInteger val;
  SQFuncState *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SQOpcode _op;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  
  SVar1 = SQFuncState::PopTarget
                    ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  _op = (SQOpcode)((ulong)SVar1 >> 0x20);
  SVar1 = SQFuncState::PopTarget
                    ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  arg1 = SQFuncState::PopTarget
                   ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  this_00 = *(SQFuncState **)(in_RDI + 8);
  uVar2 = in_ESI;
  SQFuncState::PushTarget(this_00,in_RDI);
  SQFuncState::AddInstruction
            ((SQFuncState *)CONCAT44(uVar2,in_stack_fffffffffffffff0),_op,SVar1,arg1,
             CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(SQInteger)this_00);
  return;
}

Assistant:

void EmitDerefOp(SQOpcode op)
    {
        SQInteger val = _fs->PopTarget();
        SQInteger key = _fs->PopTarget();
        SQInteger src = _fs->PopTarget();
        _fs->AddInstruction(op,_fs->PushTarget(),src,key,val);
    }